

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_fragment.cc
# Opt level: O1

void brotli::EmitDistance
               (size_t distance,uint8_t *depth,uint16_t *bits,uint32_t *histo,size_t *storage_ix,
               uint8_t *storage)

{
  byte bVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar5 = distance + 3;
  uVar3 = 0x1f;
  if ((uint)uVar5 != 0) {
    for (; (uint)uVar5 >> uVar3 == 0; uVar3 = uVar3 - 1) {
    }
  }
  uVar6 = 0x1e - (uVar3 ^ 0x1f);
  uVar8 = (ulong)((uVar5 >> ((ulong)uVar6 & 0x3f) & 1) != 0);
  uVar7 = ((uVar3 ^ 0x1f) * 2 ^ 0x3e) - 4 | uVar8;
  bVar1 = depth[uVar7 + 0x50];
  if (bits[uVar7 + 0x50] >> (bVar1 & 0x3f) == 0) {
    if (bVar1 < 0x39) {
      uVar2 = *storage_ix;
      uVar4 = bVar1 + uVar2;
      *(ulong *)(storage + (uVar2 >> 3)) =
           (ulong)bits[uVar7 + 0x50] << ((byte)uVar2 & 7) | (ulong)storage[uVar2 >> 3];
      *storage_ix = uVar4;
      uVar5 = uVar5 - (uVar8 + 2 << ((byte)uVar6 & 0x3f));
      if (uVar5 >> ((byte)uVar6 & 0x3f) != 0) goto LAB_0017e743;
      if (uVar6 < 0x39) {
        *(ulong *)(storage + (uVar4 >> 3)) = uVar5 << ((byte)uVar4 & 7) | (ulong)storage[uVar4 >> 3]
        ;
        *storage_ix = uVar6 + uVar4;
        histo[uVar7 + 0x50] = histo[uVar7 + 0x50] + 1;
        return;
      }
    }
    __assert_fail("n_bits <= 56",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/deps/brotli/enc/./write_bits.h"
                  ,0x2d,
                  "void brotli::WriteBits(size_t, uint64_t, size_t *__restrict, uint8_t *__restrict)"
                 );
  }
LAB_0017e743:
  __assert_fail("(bits >> n_bits) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/deps/brotli/enc/./write_bits.h"
                ,0x2c,
                "void brotli::WriteBits(size_t, uint64_t, size_t *__restrict, uint8_t *__restrict)")
  ;
}

Assistant:

inline void EmitDistance(size_t distance,
                         const uint8_t depth[128],
                         const uint16_t bits[128],
                         uint32_t histo[128],
                         size_t* storage_ix, uint8_t* storage) {
  distance += 3;
  const uint32_t nbits = Log2FloorNonZero(distance) - 1u;
  const size_t prefix = (distance >> nbits) & 1;
  const size_t offset = (2 + prefix) << nbits;
  const size_t distcode = 2 * (nbits - 1) + prefix + 80;
  WriteBits(depth[distcode], bits[distcode], storage_ix, storage);
  WriteBits(nbits, distance - offset, storage_ix, storage);
  ++histo[distcode];
}